

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_getdate.c
# Opt level: O0

int dayphrase(gdstate *gds)

{
  gdstate *gds_local;
  
  if (gds->tokenp->token == 0x105) {
    gds->HaveWeekDay = gds->HaveWeekDay + 1;
    gds->DayOrdinal = 1;
    gds->DayNumber = gds->tokenp->value;
    gds->tokenp = gds->tokenp + 1;
    if (gds->tokenp->token == 0x2c) {
      gds->tokenp = gds->tokenp + 1;
    }
    gds_local._4_4_ = 1;
  }
  else if ((gds->tokenp->token == 0x10b) && (gds->tokenp[1].token == 0x105)) {
    gds->HaveWeekDay = gds->HaveWeekDay + 1;
    gds->DayOrdinal = gds->tokenp->value;
    gds->DayNumber = gds->tokenp[1].value;
    gds->tokenp = gds->tokenp + 2;
    gds_local._4_4_ = 1;
  }
  else {
    gds_local._4_4_ = 0;
  }
  return gds_local._4_4_;
}

Assistant:

static int
dayphrase(struct gdstate *gds)
{
	if (gds->tokenp[0].token == tDAY) {
		/* "tues", "wednesday," */
		gds->HaveWeekDay++;
		gds->DayOrdinal = 1;
		gds->DayNumber = gds->tokenp[0].value;
		gds->tokenp += 1;
		if (gds->tokenp[0].token == ',')
			gds->tokenp += 1;
		return 1;
	}
	if (gds->tokenp[0].token == tUNUMBER
		&& gds->tokenp[1].token == tDAY) {
		/* "second tues" "3 wed" */
		gds->HaveWeekDay++;
		gds->DayOrdinal = gds->tokenp[0].value;
		gds->DayNumber = gds->tokenp[1].value;
		gds->tokenp += 2;
		return 1;
	}
	return 0;
}